

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Register.cpp
# Opt level: O0

void __thiscall Register::Register(Register *this,RegisterKind kind,uint32_t num)

{
  uint in_EDX;
  uint in_ESI;
  ushort *in_RDI;
  
  *in_RDI = 0xffff;
  *in_RDI = (ushort)(in_ESI << 8) | (ushort)in_EDX;
  if (in_ESI < 5) {
    if (0x1f < in_EDX) {
      __assert_fail("num < 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/Register.cpp"
                    ,0x65,"Register::Register(Reg::RegisterKind, uint32_t)");
    }
  }
  else {
    if (in_ESI != 5) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/Register.cpp"
                    ,0x6b,"Register::Register(Reg::RegisterKind, uint32_t)");
    }
    if (1 < in_EDX) {
      __assert_fail("num < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/Register.cpp"
                    ,0x68,"Register::Register(Reg::RegisterKind, uint32_t)");
    }
  }
  return;
}

Assistant:

Register::Register(Reg::RegisterKind kind, uint32_t num) {
  id = (kind << 8) | num;

  // check range:
  switch (kind) {
    case Reg::GPR:
    case Reg::FPR:
    case Reg::VF:
    case Reg::COP0:
    case Reg::VI:
      assert(num < 32);
      break;
    case Reg::PCR:
      assert(num < 2);
      break;
    default:
      assert(false);
  }
}